

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O2

int Map_MappingMatches(Map_Man_t *p)

{
  Map_Node_t *p_00;
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  ProgressBar *p_01;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  uVar2 = p->fMappingMode;
  if (4 < uVar2) {
    __assert_fail("p->fMappingMode >= 0 && p->fMappingMode <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperMatch.c"
                  ,0x24b,"int Map_MappingMatches(Map_Man_t *)");
  }
  if (uVar2 == 0) {
    Map_MappingSetPiArrivalTimes(p);
    uVar2 = p->fMappingMode;
  }
  if (uVar2 == 1) {
    Map_MappingEstimateRefs(p);
  }
  else if (uVar2 == 0) {
    Map_MappingEstimateRefsInit(p);
  }
  p_01 = Extra_ProgressBarStart(_stdout,p->vMapObjs->nSize);
  lVar8 = 0;
  iVar7 = 1;
  do {
    if (p->vMapObjs->nSize <= lVar8) {
LAB_0036b2a1:
      Extra_ProgressBarStop(p_01);
      return iVar7;
    }
    p_00 = p->vMapObjs->pArray[lVar8];
    iVar3 = Map_NodeIsBuf(p_00);
    if (iVar3 == 0) {
      iVar3 = Map_NodeIsAnd(p_00);
      if ((iVar3 != 0) && (p_00->pRepr == (Map_Node_t *)0x0)) {
        if (p_00->pCuts->pNext == (Map_Cut_t *)0x0) {
          Extra_ProgressBarStop(p_01);
          puts("\nError: A node in the mapping graph does not have feasible cuts.");
          return 0;
        }
        Map_MatchNodePhase(p,p_00,0);
        Map_MatchNodePhase(p,p_00,1);
        if ((p_00->pCutBest[0] == (Map_Cut_t *)0x0) && (p_00->pCutBest[1] == (Map_Cut_t *)0x0)) {
          iVar7 = 0;
          printf("\nError: Could not match both phases of AIG node %d.\n",(ulong)(uint)p_00->Num);
          puts("Please make sure that the supergate library has equivalents of AND2 or NAND2.");
          puts("If such supergates exist in the library, report a bug.");
          goto LAB_0036b2a1;
        }
        Map_NodeTryDroppingOnePhase(p,p_00);
        Map_NodeTransferArrivalTimes(p,p_00);
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar8)) {
          Extra_ProgressBarUpdate_int(p_01,(int)lVar8,"Matches ...");
        }
      }
    }
    else {
      if (p_00->p2 != (Map_Node_t *)0x0) {
        __assert_fail("pNode->p2 == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperMatch.c"
                      ,0x25f,"int Map_MappingMatches(Map_Man_t *)");
      }
      uVar5 = (ulong)p_00->p1 & 0xfffffffffffffffe;
      uVar4 = (ulong)((uint)p_00->p1 & 1);
      lVar6 = uVar4 * 0xc;
      uVar1 = *(undefined8 *)(uVar5 + 0x60 + lVar6);
      p_00->tArrival[0].Rise = (float)(int)uVar1;
      p_00->tArrival[0].Fall = (float)(int)((ulong)uVar1 >> 0x20);
      p_00->tArrival[0].Worst = *(float *)(uVar5 + 0x68 + lVar6);
      lVar6 = (uVar4 ^ 1) * 0xc;
      uVar1 = *(undefined8 *)(uVar5 + 0x60 + lVar6);
      p_00->tArrival[1].Rise = (float)(int)uVar1;
      p_00->tArrival[1].Fall = (float)(int)((ulong)uVar1 >> 0x20);
      p_00->tArrival[1].Worst = *(float *)(uVar5 + 0x68 + lVar6);
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int Map_MappingMatches( Map_Man_t * p )
{
    ProgressBar * pProgress;
    Map_Node_t * pNode;
    int i;

    assert( p->fMappingMode >= 0 && p->fMappingMode <= 4 );

    // use the externally given PI arrival times
    if ( p->fMappingMode == 0 )
        Map_MappingSetPiArrivalTimes( p );

    // estimate the fanouts
    if ( p->fMappingMode == 0 )
        Map_MappingEstimateRefsInit( p );
    else if ( p->fMappingMode == 1 )
        Map_MappingEstimateRefs( p );

    // the PI cuts are matched in the cut computation package
    // in the loop below we match the internal nodes
    pProgress = Extra_ProgressBarStart( stdout, p->vMapObjs->nSize );
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
        if ( Map_NodeIsBuf(pNode) )
        {
            assert( pNode->p2 == NULL );
            pNode->tArrival[0] = Map_Regular(pNode->p1)->tArrival[ Map_IsComplement(pNode->p1)];
            pNode->tArrival[1] = Map_Regular(pNode->p1)->tArrival[!Map_IsComplement(pNode->p1)];
            continue;
        }

        // skip primary inputs and secondary nodes if mapping with choices
        if ( !Map_NodeIsAnd( pNode ) || pNode->pRepr )
            continue;

        // make sure that at least one non-trival cut is present
        if ( pNode->pCuts->pNext == NULL )
        {
            Extra_ProgressBarStop( pProgress );
            printf( "\nError: A node in the mapping graph does not have feasible cuts.\n" );
            return 0;
        }

        // match negative phase
        if ( !Map_MatchNodePhase( p, pNode, 0 ) )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }
        // match positive phase
        if ( !Map_MatchNodePhase( p, pNode, 1 ) )
        {
            Extra_ProgressBarStop( pProgress );
            return 0;
        }

        // make sure that at least one phase is mapped
        if ( pNode->pCutBest[0] == NULL && pNode->pCutBest[1] == NULL )
        {
            printf( "\nError: Could not match both phases of AIG node %d.\n", pNode->Num );
            printf( "Please make sure that the supergate library has equivalents of AND2 or NAND2.\n" );
            printf( "If such supergates exist in the library, report a bug.\n" );
            Extra_ProgressBarStop( pProgress );
            return 0;
        }

        // if both phases are assigned, check if one of them can be dropped
        Map_NodeTryDroppingOnePhase( p, pNode );
        // set the arrival times of the node using the best cuts
        Map_NodeTransferArrivalTimes( p, pNode );

        // update the progress bar
        Extra_ProgressBarUpdate( pProgress, i, "Matches ..." );
    }
    Extra_ProgressBarStop( pProgress );
    return 1;
}